

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmap.c
# Opt level: O0

void cmap_set_game_charset(errcxdef *ec,char *internal_id,char *internal_ldesc,char *argv0)

{
  int iVar1;
  char *pcVar2;
  errcxdef *in_RDX;
  long *in_RDI;
  char filename [4096];
  long *plVar3;
  errcxdef *ctx;
  char *in_stack_ffffffffffffefc8;
  errcxdef *in_stack_ffffffffffffefd0;
  char local_1028 [8];
  _func_void_void_ptr_char_ptr_int_int_erradef_ptr *in_stack_ffffffffffffefe0;
  char *in_stack_ffffffffffffefe8;
  char *in_stack_ffffffffffffeff0;
  char *in_stack_fffffffffffff128;
  
  if (S_cmap_loaded == 0) {
    os_gen_charmap_filename
              (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0
              );
    iVar1 = cmap_load_internal(in_stack_fffffffffffff128);
    if (iVar1 != 0) {
      ctx = (errcxdef *)local_1028;
      plVar3 = in_RDI;
      strlen(local_1028);
      iVar1 = (int)((ulong)plVar3 >> 0x20);
      pcVar2 = errstr(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,(int)((ulong)ctx >> 0x20))
      ;
      *(char **)(*in_RDI + 0x18) = pcVar2;
      plVar3 = in_RDI;
      strlen((char *)in_RDX);
      pcVar2 = errstr(in_RDX,(char *)plVar3,(int)((ulong)ctx >> 0x20));
      *(char **)(*in_RDI + 0x20) = pcVar2;
      *(undefined4 *)(*in_RDI + 0x68) = 2;
      errsign(ctx,iVar1,(char *)0x1404c9);
    }
    strcpy(G_cmap_ldesc,(char *)in_RDX);
  }
  return;
}

Assistant:

void cmap_set_game_charset(errcxdef *ec,
                           char *internal_id, char *internal_ldesc,
                           char *argv0)
{
    char filename[OSFNMAX];
    
    /* 
     *   If a character set is already explicitly loaded, ignore the
     *   game's character set - the player asked us to use a particular
     *   mapping, so ignore what the game wants.  (This will probably
     *   result in incorrect display of non-ASCII character values, but
     *   the player is most likely to use this to avoid errors when an
     *   appropriate mapping file for the game is not available.  In this
     *   case, the player informs us by setting the option that he or she
     *   knows and accepts that the game will not look exactly right.)  
     */
    if (S_cmap_loaded)
        return;

    /* 
     *   ask the operating system to name the mapping file -- this routine
     *   will determine, if possible, the current native character set,
     *   and apply a system-specific naming convention to tell us what
     *   mapping file we should open 
     */
    os_gen_charmap_filename(filename, internal_id, argv0);

    /* try loading the mapping file */
    if (cmap_load_internal(filename))
        errsig2(ec, ERR_CHRNOFILE,
                ERRTSTR, errstr(ec, filename, strlen(filename)),
                ERRTSTR, errstr(ec, internal_ldesc, strlen(internal_ldesc)));

    /*
     *   We were successful - the game's internal character set is now
     *   mapped to the current native character set.  Even though we
     *   loaded an ldesc from the mapping file, forget that and store the
     *   internal ldesc that the game specified.  The reason we do this is
     *   that it's possible that the player will dynamically switch native
     *   character sets in the future, at which point we'll need to
     *   re-load the mapping table, which could raise an error if a
     *   mapping file for the new character set isn't available.  So, we
     *   may need to provide the same explanation later that we needed to
     *   provide here.  Save the game's character set ldesc for that
     *   eventuality, since it describes exactly what the *game* wanted.  
     */
    strcpy(G_cmap_ldesc, internal_ldesc);
}